

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_safe_frame.cpp
# Opt level: O0

ON_SafeFrame * __thiscall ON_SafeFrame::operator=(ON_SafeFrame *this,ON_SafeFrame *sf)

{
  uint uVar1;
  ON_SafeFrame *sf_local;
  ON_SafeFrame *this_local;
  
  if (this != sf) {
    uVar1 = (*sf->_vptr_ON_SafeFrame[5])();
    (*this->_vptr_ON_SafeFrame[6])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[7])();
    (*this->_vptr_ON_SafeFrame[8])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[9])();
    (*this->_vptr_ON_SafeFrame[10])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[0xb])();
    (*this->_vptr_ON_SafeFrame[0xc])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[0xd])();
    (*this->_vptr_ON_SafeFrame[0xe])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[0xf])();
    (*this->_vptr_ON_SafeFrame[0x10])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[0x15])();
    (*this->_vptr_ON_SafeFrame[0x16])(this,(ulong)(uVar1 & 1));
    uVar1 = (*sf->_vptr_ON_SafeFrame[0x17])();
    (*this->_vptr_ON_SafeFrame[0x18])(this,(ulong)(uVar1 & 1));
    (*sf->_vptr_ON_SafeFrame[0x11])();
    (*this->_vptr_ON_SafeFrame[0x12])();
    (*sf->_vptr_ON_SafeFrame[0x13])();
    (*this->_vptr_ON_SafeFrame[0x14])();
    (*sf->_vptr_ON_SafeFrame[0x19])();
    (*this->_vptr_ON_SafeFrame[0x1a])();
    (*sf->_vptr_ON_SafeFrame[0x1b])();
    (*this->_vptr_ON_SafeFrame[0x1c])();
  }
  return this;
}

Assistant:

const ON_SafeFrame& ON_SafeFrame::operator = (const ON_SafeFrame& sf)
{
  if (this != &sf)
  {
    SetEnabled          (sf.Enabled());
    SetPerspectiveOnly  (sf.PerspectiveOnly());
    SetFieldGridOn      (sf.FieldGridOn());
    SetLiveFrameOn      (sf.LiveFrameOn());
    SetActionFrameOn    (sf.ActionFrameOn());
    SetActionFrameLinked(sf.ActionFrameLinked());
    SetTitleFrameOn     (sf.TitleFrameOn());
    SetTitleFrameLinked (sf.TitleFrameLinked());
    SetActionFrameXScale(sf.ActionFrameXScale());
    SetActionFrameYScale(sf.ActionFrameYScale());
    SetTitleFrameXScale (sf.TitleFrameXScale());
    SetTitleFrameYScale (sf.TitleFrameYScale());
  }

  return *this;
}